

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86Jcc(uchar *stream,uint labelID,x86Cond cond,bool isNear)

{
  int iVar1;
  UnsatisfiedJump local_30;
  byte local_19;
  x86Cond local_18;
  uint uStack_14;
  bool isNear_local;
  x86Cond cond_local;
  uint labelID_local;
  uchar *stream_local;
  
  uStack_14 = labelID & 0x7fffffff;
  if (isNear) {
    *stream = '\x0f';
    stream[1] = condCode[cond] + 0x80;
  }
  else {
    *stream = condCode[cond] + 'p';
  }
  local_19 = isNear;
  local_18 = cond;
  _cond_local = stream;
  UnsatisfiedJump::UnsatisfiedJump(&local_30,uStack_14,isNear,stream);
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_30);
  iVar1 = 2;
  if ((local_19 & 1) != 0) {
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int x86Jcc(unsigned char *stream, unsigned int labelID, x86Cond cond, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
	{
		stream[0] = 0x0f;
		stream[1] = 0x80 + condCode[cond];
	}else{
		stream[0] = 0x70 + condCode[cond];
	}

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 6 : 2);
}